

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O0

QAction * __thiscall QUndoGroup::createRedoAction(QUndoGroup *this,QObject *parent,QString *prefix)

{
  bool bVar1;
  ContextType *context;
  Object *in_RDI;
  long in_FS_OFFSET;
  QAction *action;
  QString defaultText;
  QString effectivePrefix;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 uVar2;
  int in_stack_fffffffffffffe4c;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  QAction *in_stack_fffffffffffffe58;
  QString *text;
  QString *in_stack_fffffffffffffe68;
  Connection *pCVar3;
  QString *in_stack_fffffffffffffe70;
  QAction *in_stack_fffffffffffffe78;
  undefined1 **slot;
  ContextType *in_stack_fffffffffffffe98;
  ContextType *this_00;
  anon_class_56_3_b57a025f_for_o *slot_00;
  offset_in_QUndoGroup_to_subr in_stack_fffffffffffffec0;
  ConnectionType type;
  Connection local_e0 [8];
  ContextType *local_d8;
  Connection local_a0 [8];
  code *local_98;
  undefined8 local_90;
  Connection local_88 [8];
  QString local_80 [3];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QAction *local_20;
  Data *local_18;
  char16_t *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  context = (ContextType *)operator_new(0x10);
  QAction::QAction((QAction *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (QObject *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  this_00 = context;
  canRedo((QUndoGroup *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  QAction::setEnabled(in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57);
  local_20 = (QAction *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0xa89610);
  bVar1 = QString::isEmpty((QString *)0xa8961d);
  if (bVar1) {
    tr((char *)in_stack_fffffffffffffe58,
       (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
       in_stack_fffffffffffffe4c);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0xa89665);
    tr((char *)in_stack_fffffffffffffe58,
       (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
       in_stack_fffffffffffffe4c);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0xa896a7);
  }
  text = local_80;
  redoText((QUndoGroup *)this_00);
  slot_00 = (anon_class_56_3_b57a025f_for_o *)&stack0xffffffffffffffe0;
  slot = &local_38;
  QUndoStackPrivate::setPrefixedText
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,text);
  QString::~QString((QString *)0xa896fe);
  local_98 = QAction::setEnabled;
  local_90 = 0;
  type = 0xa88cb0;
  uVar2 = 0;
  pCVar3 = local_88;
  QObject::connect<void(QUndoGroup::*)(bool),void(QAction::*)(bool)>
            ((Object *)slot_00,in_stack_fffffffffffffec0,(ContextType *)in_stack_fffffffffffffe98,
             (offset_in_QAction_to_subr *)slot,0xa88cb0);
  QMetaObject::Connection::~Connection(pCVar3);
  local_d8 = this_00;
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (QString *)CONCAT44(in_stack_fffffffffffffe4c,uVar2));
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (QString *)CONCAT44(in_stack_fffffffffffffe4c,uVar2));
  pCVar3 = local_a0;
  QObject::
  connect<void(QUndoGroup::*)(QString_const&),QUndoGroup::createRedoAction(QObject*,QString_const&)const::__0>
            (in_RDI,(offset_in_QUndoGroup_to_subr)redoTextChanged,context,slot_00,
             (ConnectionType)this_00);
  QMetaObject::Connection::~Connection(pCVar3);
  createRedoAction(QObject*,QString_const&)::~__0
            ((anon_class_56_3_b57a025f_for_o *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  QObject::connect<void(QAction::*)(bool),void(QUndoGroup::*)()>
            ((Object *)slot_00,(offset_in_QAction_to_subr)QAction::triggered,
             in_stack_fffffffffffffe98,(offset_in_QUndoGroup_to_subr *)slot,type);
  QMetaObject::Connection::~Connection(local_e0);
  QString::~QString((QString *)0xa898b9);
  QString::~QString((QString *)0xa898c3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QAction *)this_00;
}

Assistant:

QAction *QUndoGroup::createRedoAction(QObject *parent, const QString &prefix) const
{
    QAction *action = new QAction(parent);
    action->setEnabled(canRedo());

    QString effectivePrefix = prefix;
    QString defaultText;
    if (prefix.isEmpty()) {
        effectivePrefix = tr("Redo %1");
        defaultText = tr("Redo", "Default text for redo action");
    }

    QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, redoText());

    connect(this, &QUndoGroup::canRedoChanged, action, &QAction::setEnabled);
    connect(this, &QUndoGroup::redoTextChanged, action, [=](const QString &text) {
        QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, text);
    });
    connect(action, &QAction::triggered, this, &QUndoGroup::redo);
    return action;
}